

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<const_volatile_void_*,_const_void_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const_volatile*,void_const*>>::
findNode<void_const_volatile*>
          (Data<QHashPrivate::Node<void_const_volatile*,void_const*>> *this,void **key)

{
  byte bVar1;
  Node<const_volatile_void_*,_const_void_*> *pNVar2;
  ulong uVar3;
  Bucket BVar4;
  
  uVar3 = ((*(ulong *)(this + 0x18) ^ (ulong)*key) >> 0x20 ^ *(ulong *)(this + 0x18) ^ (ulong)*key)
          * -0x2917014799a6026d;
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  BVar4 = findBucketWithHash<void_const_volatile*>(this,key,uVar3 >> 0x20 ^ uVar3);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<const_volatile_void_*,_const_void_*> *)0x0;
  }
  else {
    pNVar2 = (Node<const_volatile_void_*,_const_void_*> *)((BVar4.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }